

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

word Abc_TtDeriveBiDecOne(word *pTruth,int nVars,int This)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int w;
  int iVar4;
  ulong uVar5;
  word *pwVar6;
  word wVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  word *pwVar11;
  ulong uVar12;
  ulong uVar13;
  word *pwVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  word pTemp [64];
  word Cof1 [64];
  word Cof0 [64];
  
  uVar16 = (ulong)(uint)(1 << ((char)nVars - 6U & 0x1f));
  if (nVars < 7) {
    uVar16 = 1;
  }
  iVar4 = (int)uVar16;
  Abc_TtCopy(pTemp,pTruth,iVar4,0);
  uVar13 = 0;
  if (0 < iVar4) {
    uVar13 = uVar16;
  }
  uVar18 = 0;
  uVar15 = 0;
  if (0 < nVars) {
    uVar18 = nVars;
    uVar15 = 0;
  }
  for (; uVar15 != uVar18; uVar15 = uVar15 + 1) {
    if (((uint)This >> (uVar15 & 0x1f) & 1) == 0) {
      Abc_TtCofactor0p(Cof0,pTemp,iVar4,uVar15);
      Abc_TtCofactor1p(Cof1,pTemp,iVar4,uVar15);
      for (uVar5 = 0; uVar13 != uVar5; uVar5 = uVar5 + 1) {
        pTemp[uVar5] = Cof1[uVar5] | Cof0[uVar5];
      }
    }
  }
  iVar4 = Abc_TtBitCount16(This);
  if (0x10 < nVars) {
    __assert_fail("nVarsAll <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0x6df,"void Abc_TtShrink(word *, int, int, unsigned int)");
  }
  iVar10 = 0;
  for (uVar13 = 0; uVar13 != uVar18; uVar13 = uVar13 + 1) {
    if (((uint)This >> ((uint)uVar13 & 0x1f) & 1) != 0) {
      uVar5 = uVar13;
      while ((long)iVar10 < (long)uVar5) {
        uVar1 = uVar5 - 1;
        if ((long)uVar5 < 6) {
          uVar12 = s_PMasks[uVar1][0];
          uVar2 = s_PMasks[uVar1][1];
          uVar3 = s_PMasks[uVar1][2];
          for (uVar17 = 0; uVar5 = uVar1, uVar16 != uVar17; uVar17 = uVar17 + 1) {
            uVar5 = pTemp[uVar17];
            bVar8 = (byte)(1 << ((byte)uVar1 & 0x1f));
            pTemp[uVar17] =
                 (uVar5 & uVar3) >> (bVar8 & 0x3f) |
                 (uVar5 & uVar2) << (bVar8 & 0x3f) | uVar5 & uVar12;
          }
        }
        else if (uVar1 == 5) {
          for (pwVar6 = pTemp; uVar5 = uVar1, pwVar6 < pTemp + uVar16; pwVar6 = pwVar6 + 2) {
            *(ulong *)((long)pwVar6 + 4) =
                 CONCAT44((int)*(undefined8 *)((long)pwVar6 + 4),
                          (int)((ulong)*(undefined8 *)((long)pwVar6 + 4) >> 0x20));
          }
        }
        else {
          uVar15 = 1 << ((char)uVar5 - 7U & 0x1f);
          if (uVar5 < 8) {
            uVar15 = 1;
          }
          iVar9 = uVar15 * 4;
          uVar12 = 0;
          if (0 < (int)uVar15) {
            uVar12 = (ulong)uVar15;
          }
          pwVar11 = pTemp + (int)(uVar15 * 2);
          pwVar14 = pTemp + (int)uVar15;
          for (pwVar6 = pTemp; uVar5 = uVar1, pwVar6 < pTemp + uVar16; pwVar6 = pwVar6 + iVar9) {
            for (uVar5 = 0; uVar12 != uVar5; uVar5 = uVar5 + 1) {
              wVar7 = pwVar14[uVar5];
              pwVar14[uVar5] = pwVar11[uVar5];
              pwVar11[uVar5] = wVar7;
            }
            pwVar11 = pwVar11 + iVar9;
            pwVar14 = pwVar14 + iVar9;
          }
        }
      }
      iVar10 = iVar10 + 1;
    }
  }
  if (iVar10 != iVar4) {
    __assert_fail("Var == nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0x6e7,"void Abc_TtShrink(word *, int, int, unsigned int)");
  }
  wVar7 = Abc_Tt6Stretch(pTemp[0],iVar4);
  return wVar7;
}

Assistant:

static inline word Abc_TtDeriveBiDecOne( word * pTruth, int nVars, int This )
{
    word pTemp[64]; 
    int nThis = Abc_TtBitCount16(This);
    int v, nWords = Abc_TtWordNum(nVars);
    Abc_TtCopy( pTemp, pTruth, nWords, 0 );
    for ( v = 0; v < nVars; v++ )
        if ( !((This >> v) & 1) )
            Abc_TtExist( pTemp, v, nWords );
    Abc_TtShrink( pTemp, nThis, nVars, This );
    return Abc_Tt6Stretch( pTemp[0], nThis );
}